

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::StateInteractionCase::iterate(StateInteractionCase *this)

{
  deUint64 *this_00;
  glUseProgramFunc p_Var1;
  glUniform4fFunc p_Var2;
  glGetUniformLocationFunc p_Var3;
  glProgramUniform4fFunc p_Var4;
  glGetAttribLocationFunc p_Var5;
  glProgramParameteriFunc p_Var6;
  glLinkProgramFunc p_Var7;
  glUseProgramStagesFunc p_Var8;
  GLuint GVar9;
  bool bVar10;
  int iVar11;
  int y;
  deUint32 dVar12;
  GLint GVar13;
  GLenum GVar14;
  ContextType type;
  TestLog *this_01;
  RenderContext *pRVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MessageBuilder *pMVar16;
  char *pcVar17;
  ulong uVar18;
  TestError *pTVar19;
  GLSLVersion glslVersion;
  GLSLVersion glslVersion_00;
  char *local_a60;
  MessageBuilder local_a58;
  ApiType local_8d8;
  deUint32 local_8d4;
  Surface local_8d0;
  PixelBufferAccess local_8b8;
  MessageBuilder local_890;
  int local_710;
  int local_70c;
  int numOutputs;
  int numInputs;
  int maxVars;
  PixelBufferAccess local_6e8;
  string local_6c0 [8];
  string noMain;
  Surface local_698;
  PixelBufferAccess local_680;
  GLuint local_658;
  deUint32 local_654;
  GLuint vshader;
  PixelBufferAccess local_638;
  int local_610;
  deUint32 local_60c;
  GLint value;
  PixelBufferAccess local_5f0;
  ApiType local_5c4;
  GLuint local_5c0;
  deUint32 local_5bc;
  int posLoc;
  PixelBufferAccess local_5a0;
  PrimitiveList local_578;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  VertexArrayBinding posArray;
  float position [16];
  size_t pos;
  string local_490;
  allocator<char> local_469;
  string local_468;
  ProgramSources local_448;
  undefined1 local_378 [8];
  ShaderProgram progVF;
  string local_288;
  MessageBuilder local_258;
  GLenum local_d4;
  GLchar *pGStack_d0;
  GLenum err;
  char *srcStrings [1];
  string local_c0 [4];
  GLuint pipeline;
  string frag2;
  string frag;
  string vtx;
  GLuint local_58;
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  GLuint programB;
  GLuint programA;
  Surface renderedFrame;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Functions *gl;
  TestLog *log;
  StateInteractionCase *this_local;
  Functions *gl_00;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar11 = (*pRVar15->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar11);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar11 = (*pRVar15->_vptr_RenderContext[4])();
  y = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar11));
  renderedFrame.m_pixels.m_cap._4_4_ = de::min<int>(0x10,y);
  iVar11 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar11));
  renderedFrame.m_pixels.m_cap._0_4_ = de::min<int>(0x10,iVar11);
  tcu::Surface::Surface
            ((Surface *)&programB,renderedFrame.m_pixels.m_cap._4_4_,
             (int)renderedFrame.m_pixels.m_cap);
  std::__cxx11::string::string((string *)(frag.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(frag2.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_c0);
  tcu::TestLog::operator<<(&local_258,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar16 = tcu::MessageBuilder::operator<<
                      (&local_258,(char (*) [35])"Begin:StateInteractionCase iterate");
  tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_258);
  (*gl_00->viewport)(0,0,renderedFrame.m_pixels.m_cap._4_4_,(int)renderedFrame.m_pixels.m_cap);
  (*gl_00->clearColor)(0.0,0.0,0.0,0.0);
  (*gl_00->clear)(0x4000);
  generateBasicVertexSrc_abi_cxx11_(&local_288,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)(frag.field_2._M_local_buf + 8),(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)&progVF.m_program.m_info.linkTimeUs,(glcts *)(ulong)this->m_glslVersion,
             glslVersion_00);
  this_00 = &progVF.m_program.m_info.linkTimeUs;
  std::__cxx11::string::operator=((string *)(frag2.field_2._M_local_buf + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar17 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,pcVar17,&local_469);
  pcVar17 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,pcVar17,(allocator<char> *)((long)&pos + 7));
  glu::makeVtxFragSources(&local_448,&local_468,&local_490);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_378,pRVar15,&local_448);
  glu::ProgramSources::~ProgramSources(&local_448);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  p_Var1 = gl_00->useProgram;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  (*p_Var1)(dVar12);
  p_Var2 = gl_00->uniform4f;
  p_Var3 = gl_00->getUniformLocation;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  GVar13 = (*p_Var3)(dVar12,"u_color");
  (*p_Var2)(GVar13,0.0,1.0,0.0,1.0);
  (*gl_00->genProgramPipelines)(1,(GLuint *)((long)srcStrings + 4));
  std::__cxx11::string::operator=(local_c0,(string *)(frag2.field_2._M_local_buf + 8));
  while (uVar18 = std::__cxx11::string::find((char *)local_c0,0x2b64971),
        uVar18 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)local_c0,uVar18,(char *)0x7);
  }
  pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
  vao = (*gl_00->createShaderProgramv)(0x8b31,1,&stack0xffffffffffffff30);
  bVar10 = checkCSProg(this,gl_00,vao,1);
  if (!bVar10) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8ad);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
  vertexBuf = (*gl_00->createShaderProgramv)(0x8b30,1,&stack0xffffffffffffff30);
  bVar10 = checkCSProg(this,gl_00,vertexBuf,1);
  GVar9 = vertexBuf;
  if (!bVar10) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8b3);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var4 = gl_00->programUniform4f;
  GVar13 = (*gl_00->getUniformLocation)(vertexBuf,"u_clrPB");
  (*p_Var4)(GVar9,GVar13,0.0,0.0,1.0,1.0);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,vao);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
  (*gl_00->bindProgramPipeline)(srcStrings[0]._4_4_);
  posArray.pointer.data = (void *)0xbf800000bf800000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"a_position",&local_559);
  glu::va::Float((VertexArrayBinding *)local_538,&local_558,4,4,0,(float *)&posArray.pointer.data);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  glu::pr::Triangles(&local_578,6,iterate::quadIndices);
  glu::draw(pRVar15,dVar12,1,(VertexArrayBinding *)local_538,&local_578,(DrawUtilCallback *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"StateInteraction glu::draw failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x8c3);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_5a0,(Surface *)&programB);
  glu::readPixels(pRVar15,0,0,&local_5a0);
  tcu::Surface::Surface((Surface *)&posLoc,(Surface *)&programB);
  local_5bc = (deUint32)tcu::RGBA::green();
  bVar10 = checkSurface(this,(Surface *)&posLoc,(RGBA)local_5bc);
  tcu::Surface::~Surface((Surface *)&posLoc);
  if (((bVar10 ^ 0xffU) & 1) != 0) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"StateInteraction failed; surface should be green",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8ca);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var5 = gl_00->getAttribLocation;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  local_5c0 = (*p_Var5)(dVar12,"a_position");
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_5c4.m_bits = (*pRVar15->_vptr_RenderContext[2])();
  bVar10 = glu::isContextTypeES((ContextType)local_5c4.m_bits);
  if (bVar10) {
    (*gl_00->disableVertexAttribArray)(local_5c0);
  }
  (*gl_00->genVertexArrays)(1,&indexBuf);
  (*gl_00->bindVertexArray)(indexBuf);
  (*gl_00->genBuffers)(1,(GLuint *)(vtx.field_2._M_local_buf + 0xc));
  (*gl_00->bindBuffer)(0x8893,vtx.field_2._12_4_);
  (*gl_00->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
  (*gl_00->genBuffers)(1,&local_58);
  (*gl_00->bindBuffer)(0x8892,local_58);
  (*gl_00->bufferData)(0x8892,0x40,&posArray.pointer.data,0x88e4);
  local_5c0 = (*gl_00->getAttribLocation)(vao,"a_position");
  (*gl_00->vertexAttribPointer)(local_5c0,4,0x1406,'\0',0,(void *)0x0);
  (*gl_00->enableVertexAttribArray)(local_5c0);
  (*gl_00->bindBuffer)(0x8892,0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"VAO setup failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x8e4);
  (*gl_00->useProgram)(0);
  (*gl_00->bindProgramPipeline)(srcStrings[0]._4_4_);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"DrawElements failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x8ed);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_5f0,(Surface *)&programB);
  glu::readPixels(pRVar15,0,0,&local_5f0);
  tcu::Surface::Surface((Surface *)&value,(Surface *)&programB);
  local_60c = (deUint32)tcu::RGBA::blue();
  bVar10 = checkSurface(this,(Surface *)&value,(RGBA)local_60c);
  tcu::Surface::~Surface((Surface *)&value);
  if (((bVar10 ^ 0xffU) & 1) != 0) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"StateInteraction failed; surface should be blue",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x8f4);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->useProgram)(0);
  (*gl_00->bindProgramPipeline)(0);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"DrawElements failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x8fd);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,0);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
  (*gl_00->bindProgramPipeline)(srcStrings[0]._4_4_);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"DrawElements failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x905);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,vao);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,0);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"DrawElements failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x90b);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,3,vao);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  GVar14 = (*gl_00->getError)();
  glu::checkError(GVar14,"DrawElements failure",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x911);
  p_Var6 = gl_00->programParameteri;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  (*p_Var6)(dVar12,0x8258,1);
  p_Var7 = gl_00->linkProgram;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  (*p_Var7)(dVar12);
  GVar9 = srcStrings[0]._4_4_;
  p_Var8 = gl_00->useProgramStages;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  (*p_Var8)(GVar9,1,dVar12);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  local_d4 = (*gl_00->getError)();
  if (local_d4 != 0x502) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"DrawElements failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x91d);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->validateProgramPipeline)(srcStrings[0]._4_4_);
  (*gl_00->getProgramPipelineiv)(srcStrings[0]._4_4_,0x8b83,&local_610);
  if (local_610 != 0) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Program pipeline validation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x925);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,0);
  GVar9 = srcStrings[0]._4_4_;
  p_Var8 = gl_00->useProgramStages;
  dVar12 = glu::ShaderProgram::getProgram((ShaderProgram *)local_378);
  (*p_Var8)(GVar9,2,dVar12);
  (*gl_00->validateProgramPipeline)(srcStrings[0]._4_4_);
  (*gl_00->getProgramPipelineiv)(srcStrings[0]._4_4_,0x8b83,&local_610);
  if (local_610 != 0) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Program pipeline validation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x931);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  local_d4 = (*gl_00->getError)();
  if (local_d4 != 0x502) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"DrawElements failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x938);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,vao);
  (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
  GVar9 = vertexBuf;
  p_Var4 = gl_00->programUniform4f;
  GVar13 = (*gl_00->getUniformLocation)(vertexBuf,"u_clrPB");
  (*p_Var4)(GVar9,GVar13,1.0,0.0,0.0,1.0);
  (*gl_00->deleteProgram)(vertexBuf);
  (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
  pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_638,(Surface *)&programB);
  glu::readPixels(pRVar15,0,0,&local_638);
  tcu::Surface::Surface((Surface *)&vshader,(Surface *)&programB);
  local_654 = (deUint32)tcu::RGBA::red();
  bVar10 = checkSurface(this,(Surface *)&vshader,(RGBA)local_654);
  tcu::Surface::~Surface((Surface *)&vshader);
  if (((bVar10 ^ 0xffU) & 1) != 0) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"StateInteraction failed; surface should be red",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x94a);
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
  vertexBuf = (*gl_00->createShaderProgramv)(0x8b30,1,&stack0xffffffffffffff30);
  bVar10 = checkCSProg(this,gl_00,vertexBuf,1);
  GVar9 = vertexBuf;
  if (bVar10) {
    p_Var4 = gl_00->programUniform4f;
    GVar13 = (*gl_00->getUniformLocation)(vertexBuf,"u_clrPB");
    (*p_Var4)(GVar9,GVar13,0.0,1.0,0.0,1.0);
    (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
    local_658 = (*gl_00->createShader)(0x8b30);
    pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
    (*gl_00->shaderSource)(local_658,1,&stack0xffffffffffffff30,(GLint *)0x0);
    (*gl_00->compileShader)(local_658);
    (*gl_00->getShaderiv)(local_658,0x8b81,&local_610);
    (*gl_00->attachShader)(vertexBuf,local_658);
    (*gl_00->getProgramiv)(vertexBuf,0x8b82,&local_610);
    if (local_610 != 1) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"Shader attachment shouldn\'t affect link status",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x965);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
    GVar14 = (*gl_00->getError)();
    glu::checkError(GVar14,"DrawElements failure",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                    ,0x969);
    pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess(&local_680,(Surface *)&programB);
    glu::readPixels(pRVar15,0,0,&local_680);
    tcu::Surface::Surface(&local_698,(Surface *)&programB);
    noMain.field_2._12_4_ = tcu::RGBA::green();
    bVar10 = checkSurface(this,&local_698,(RGBA)noMain.field_2._12_4_);
    tcu::Surface::~Surface(&local_698);
    GVar9 = vertexBuf;
    if (((bVar10 ^ 0xffU) & 1) != 0) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"StateInteraction failed; surface should be green",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x970);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    p_Var4 = gl_00->programUniform4f;
    GVar13 = (*gl_00->getUniformLocation)(vertexBuf,"u_clrPB");
    (*p_Var4)(GVar9,GVar13,1.0,1.0,1.0,1.0);
    std::__cxx11::string::string(local_6c0,(string *)(frag2.field_2._M_local_buf + 8));
    uVar18 = std::__cxx11::string::find((char *)local_6c0,0x2aa7028);
    std::__cxx11::string::replace((ulong)local_6c0,uVar18,&DAT_00000004);
    pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
    (*gl_00->shaderSource)(local_658,1,&stack0xffffffffffffff30,(GLint *)0x0);
    (*gl_00->compileShader)(local_658);
    (*gl_00->getShaderiv)(local_658,0x8b81,&local_610);
    (*gl_00->attachShader)(vertexBuf,local_658);
    (*gl_00->linkProgram)(vertexBuf);
    local_d4 = (*gl_00->getError)();
    (*gl_00->getProgramiv)(vertexBuf,0x8b82,&local_610);
    if (local_610 != 0) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"StateInteraction failed; link failure",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x987);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
    pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess(&local_6e8,(Surface *)&programB);
    glu::readPixels(pRVar15,0,0,&local_6e8);
    tcu::Surface::Surface((Surface *)&maxVars,(Surface *)&programB);
    numInputs = (int)tcu::RGBA::white();
    bVar10 = checkSurface(this,(Surface *)&maxVars,(RGBA)numInputs);
    tcu::Surface::~Surface((Surface *)&maxVars);
    if (((bVar10 ^ 0xffU) & 1) != 0) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"StateInteraction failed; surface should be white",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x991);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*gl_00->deleteProgram)(vao);
    (*gl_00->deleteProgram)(vertexBuf);
    numOutputs = 6;
    local_70c = 0;
    do {
      if (numOutputs <= local_70c) {
        (*gl_00->bindProgramPipeline)(0);
        (*gl_00->bindVertexArray)(0);
        (*gl_00->deleteProgramPipelines)(1,(GLuint *)((long)srcStrings + 4));
        (*gl_00->deleteShader)(local_658);
        (*gl_00->deleteVertexArrays)(1,&indexBuf);
        (*gl_00->deleteBuffers)(1,(GLuint *)(vtx.field_2._M_local_buf + 0xc));
        (*gl_00->deleteBuffers)(1,&local_58);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        std::__cxx11::string::~string(local_6c0);
        glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_538);
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_378);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string((string *)(frag2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(frag.field_2._M_local_buf + 8));
        tcu::Surface::~Surface((Surface *)&programB);
        return STOP;
      }
      for (local_710 = 0; local_710 < numOutputs; local_710 = local_710 + 1) {
        generateVarLinkVertexShaderSrc
                  (this,(string *)((long)&frag.field_2 + 8),this->m_glslVersion,local_710);
        generateVarLinkFragmentShaderSrc
                  (this,(string *)((long)&frag2.field_2 + 8),this->m_glslVersion,local_70c);
        pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
        vao = (*gl_00->createShaderProgramv)(0x8b31,1,&stack0xffffffffffffff30);
        bVar10 = checkCSProg(this,gl_00,vao,1);
        if (!bVar10) {
          pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar19,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x9a6);
          __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pGStack_d0 = (GLchar *)std::__cxx11::string::c_str();
        vertexBuf = (*gl_00->createShaderProgramv)(0x8b30,1,&stack0xffffffffffffff30);
        bVar10 = checkCSProg(this,gl_00,vertexBuf,1);
        if (!bVar10) {
          pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar19,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0x9ad);
          __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*gl_00->useProgramStages)(srcStrings[0]._4_4_,1,vao);
        (*gl_00->useProgramStages)(srcStrings[0]._4_4_,2,vertexBuf);
        GVar14 = (*gl_00->getError)();
        glu::checkError(GVar14,"UseProgramStages failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0x9b2);
        (*gl_00->validateProgramPipeline)(srcStrings[0]._4_4_);
        (*gl_00->getProgramPipelineiv)(srcStrings[0]._4_4_,0x8b83,&local_610);
        if (local_70c == local_710) {
          if (local_610 != 1) {
            tcu::TestLog::operator<<(&local_890,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar16 = tcu::MessageBuilder::operator<<
                                (&local_890,
                                 (char (*) [66])
                                 "Matched input and output variables should validate successfully.\n"
                                );
            pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [16])0x2b241b5);
            pMVar16 = tcu::MessageBuilder::operator<<
                                (pMVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&frag.field_2 + 8));
            pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [18])0x2b2420a);
            pMVar16 = tcu::MessageBuilder::operator<<
                                (pMVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&frag2.field_2 + 8));
            tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_890);
            pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar19,"StateInteraction failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x9c0);
            __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (*gl_00->clear)(0x4000);
          GVar9 = vao;
          p_Var4 = gl_00->programUniform4f;
          GVar13 = (*gl_00->getUniformLocation)(vao,"u_color");
          (*p_Var4)(GVar9,GVar13,1.0,1.0,1.0,1.0);
          (*gl_00->drawElements)(4,6,0x1403,(void *)0x0);
          GVar14 = (*gl_00->getError)();
          glu::checkError(GVar14,"DrawElements failure",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0x9c6);
          pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
          tcu::Surface::getAccess(&local_8b8,(Surface *)&programB);
          glu::readPixels(pRVar15,0,0,&local_8b8);
          tcu::Surface::Surface(&local_8d0,(Surface *)&programB);
          local_8d4 = (deUint32)tcu::RGBA::white();
          bVar10 = checkSurface(this,&local_8d0,(RGBA)local_8d4);
          tcu::Surface::~Surface(&local_8d0);
          if (((bVar10 ^ 0xffU) & 1) != 0) {
            pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar19,"StateInteraction failed; surface should be white",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x9cd);
            __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        else {
          pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
          local_8d8.m_bits = (*pRVar15->_vptr_RenderContext[2])();
          bVar10 = glu::isContextTypeES((ContextType)local_8d8.m_bits);
          if (bVar10 != (local_610 == 0)) {
            tcu::TestLog::operator<<(&local_a58,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar16 = tcu::MessageBuilder::operator<<
                                (&local_a58,
                                 (char (*) [58])
                                 "Mismatched input and output variables; validation should ");
            pRVar15 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
            type.super_ApiType.m_bits = (ApiType)(*pRVar15->_vptr_RenderContext[2])();
            bVar10 = glu::isContextTypeES(type);
            local_a60 = "succeed.\n";
            if (bVar10) {
              local_a60 = "fail.\n";
            }
            pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_a60);
            pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [16])0x2b241b5);
            pMVar16 = tcu::MessageBuilder::operator<<
                                (pMVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&frag.field_2 + 8));
            pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [18])0x2b2420a);
            pMVar16 = tcu::MessageBuilder::operator<<
                                (pMVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&frag2.field_2 + 8));
            tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_a58);
            pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar19,"StateInteraction failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x9dc);
            __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        (*gl_00->deleteProgram)(vao);
        (*gl_00->deleteProgram)(vertexBuf);
      }
      local_70c = local_70c + 1;
    } while( true );
  }
  pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar19,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
             ,0x952);
  __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLenum err;

		log << TestLog::Message << "Begin:StateInteractionCase iterate" << TestLog::EndMessage;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		// Check the precedence of glUseProgram over glBindProgramPipeline
		// The program bound with glUseProgram will draw green, the programs
		// bound with glBindProgramPipeline will render blue.
		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		gl.useProgram(progVF.getProgram());
		// Ouput green in the fragment shader
		gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Create and bind a pipeline with a different fragment shader
		gl.genProgramPipelines(1, &pipeline);
		// Use a different uniform name in another fragment shader
		frag2	  = frag;
		size_t pos = 0;
		while ((pos = frag2.find("u_color", pos)) != std::string::npos)
		{
			frag2.replace(pos, 7, "u_clrPB");
			pos += 7;
		}

		srcStrings[0] = vtx.c_str();
		programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programA))
		{
			TCU_FAIL("CreateShaderProgramv failed for vertex shader");
		}
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Program B outputs blue.
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		// Draw a quad with glu::draw
		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), progVF.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction glu::draw failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// useProgram takes precedence and the buffer should be green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// The position attribute locations may be different.
		int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			gl.disableVertexAttribArray(posLoc);

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		posLoc = gl.getAttribLocation(programA, "a_position");
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(posLoc);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "VAO setup failure");

		// bindProgramPipeline without a program installed by useProgram
		// Rerender the quad.  Don't use glu::draw because it takes the
		// program as a parameter and sets state.
		gl.useProgram(0);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// bindProgramPipeline will render blue
		if (!checkSurface(renderedFrame, tcu::RGBA::blue()))
		{
			TCU_FAIL("StateInteraction failed; surface should be blue");
		}

		// Test rendering with no program bound.  Rendering is undefined
		// but shouldn't produce an error.
		gl.useProgram(0);
		gl.bindProgramPipeline(0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Render call with missing pipeline stages should not generate an error
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
		gl.bindProgramPipeline(pipeline);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, 0);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Missing program for fragment shader
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, programA);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		// Separable program with both vertex and fragment shaders attached to only one stage

		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, progVF.getProgram());

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		gl.validateProgramPipeline(pipeline);
		glw::GLint value;
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		// attached to just the fragment shader
		// Call validateProgramPipeline before rendering this time
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, 0);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, progVF.getProgram());

		gl.validateProgramPipeline(pipeline);
		gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("Program pipeline validation failed");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("DrawElements failed");
		}

		// Program deletion
		gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// Program B renders red this time
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 0.0f, 0.0f, 1.0f);

		gl.deleteProgram(programB);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect red
		if (!checkSurface(renderedFrame, tcu::RGBA::red()))
		{
			TCU_FAIL("StateInteraction failed; surface should be red");
		}

		// Attach new shader
		srcStrings[0] = frag2.c_str();
		programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
		if (!checkCSProg(gl, programB))
		{
			TCU_FAIL("CreateShaderProgramv failed for fragment shader");
		}
		// Render green
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 0.0f, 1.0f, 0.0f, 1.0f);
		gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);

		// new shader
		glw::GLuint vshader = gl.createShader(GL_FRAGMENT_SHADER);
		srcStrings[0]		= frag.c_str(); // First frag shader with u_color uniform
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		DE_ASSERT(value == GL_TRUE);
		gl.attachShader(programB, vshader);

		// changing shader shouldn't affect link_status
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 1)
		{
			TCU_FAIL("Shader attachment shouldn't affect link status");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect green
		if (!checkSurface(renderedFrame, tcu::RGBA::green()))
		{
			TCU_FAIL("StateInteraction failed; surface should be green");
		}

		// Negative Case: Unsuccessfully linked program should not affect current program

		// Render white
		gl.programUniform4f(programB, gl.getUniformLocation(programB, "u_clrPB"), 1.0f, 1.0f, 1.0f, 1.0f);
		std::string noMain = frag;
		pos				   = noMain.find("main", 0);
		noMain.replace(pos, 4, "niaM");

		srcStrings[0] = noMain.c_str();
		gl.shaderSource(vshader, 1, srcStrings, NULL);
		gl.compileShader(vshader);
		gl.getShaderiv(vshader, GL_COMPILE_STATUS, &value);
		gl.attachShader(programB, vshader);
		gl.linkProgram(programB);
		err = gl.getError();

		// link_status should be false
		gl.getProgramiv(programB, GL_LINK_STATUS, &value);
		if (value != 0)
		{
			TCU_FAIL("StateInteraction failed; link failure");
		}

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);

		glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

		// expect white
		if (!checkSurface(renderedFrame, tcu::RGBA::white()))
		{
			TCU_FAIL("StateInteraction failed; surface should be white");
		}

		gl.deleteProgram(programA);
		gl.deleteProgram(programB);

		// Shader interface matching inputs/outputs

		int maxVars = 6; // generate code supports 6 variables
		for (int numInputs = 0; numInputs < maxVars; numInputs++)
		{
			for (int numOutputs = 0; numOutputs < maxVars; numOutputs++)
			{

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, numOutputs);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, numInputs);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}

				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgramStages failure");

				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);

				// Matched input and output variables should render
				if (numInputs == numOutputs)
				{
					if (value != 1)
					{
						log << TestLog::Message << "Matched input and output variables should validate successfully.\n"
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
					gl.clear(GL_COLOR_BUFFER_BIT);
					// white
					gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
					gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
					GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");

					glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

					// expect white
					if (!checkSurface(renderedFrame, tcu::RGBA::white()))
					{
						TCU_FAIL("StateInteraction failed; surface should be white");
					}
				}
				else
				{
					// Mismatched input and output variables
					// For OpenGL ES contexts, this should cause a validation failure
					// For OpenGL contexts, validation should succeed.
					if (glu::isContextTypeES(m_context.getRenderContext().getType()) != (value == 0))
					{
						log << TestLog::Message << "Mismatched input and output variables; validation should "
							<< (glu::isContextTypeES(m_context.getRenderContext().getType()) ? "fail.\n" : "succeed.\n")
							<< "Vertex Shader:\n"
							<< vtx << "Fragment Shader:\n"
							<< frag << TestLog::EndMessage;
						TCU_FAIL("StateInteraction failed");
					}
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
			}
		}

		gl.bindProgramPipeline(0);
		gl.bindVertexArray(0);
		gl.deleteProgramPipelines(1, &pipeline);
		gl.deleteShader(vshader);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}